

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowdiscrepancy.h
# Opt level: O2

void __thiscall
pbrt::DigitPermutation::DigitPermutation
          (DigitPermutation *this,int base,uint32_t seed,Allocator alloc)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  int iVar3;
  long lVar4;
  float fVar5;
  int vb;
  int va;
  ulong local_40;
  ulong local_38;
  
  this->base = base;
  vb = 0x10000;
  va = base;
  if (base < 0x10000) {
    fVar5 = 1.0;
    this->nDigits = 0;
    iVar1 = 0;
    iVar3 = 1;
    while( true ) {
      if (1.0 <= 1.0 - fVar5) break;
      this->nDigits = iVar3;
      fVar5 = (1.0 / (float)base) * fVar5;
      iVar1 = iVar1 + base;
      iVar3 = iVar3 + 1;
    }
    iVar3 = (*(alloc.memoryResource)->_vptr_memory_resource[2])
                      (alloc.memoryResource,(long)iVar1 * 2,2);
    this->permutations = (uint16_t *)CONCAT44(extraout_var,iVar3);
    local_40 = (ulong)(uint)(base << 5);
    for (local_38 = 0; iVar3 = (int)local_38, iVar3 < this->nDigits;
        local_38 = (ulong)((int)local_38 + 1)) {
      iVar1 = (int)local_40;
      for (lVar4 = 0; (~(base >> 0x1f) & base) != (uint32_t)lVar4; lVar4 = lVar4 + 1) {
        iVar2 = PermutationElement((uint32_t)lVar4,base,iVar3 + iVar1 ^ seed);
        this->permutations[(long)this->base * (long)iVar3 + lVar4] = (uint16_t)iVar2;
      }
    }
    return;
  }
  LogFatal<char_const(&)[5],char_const(&)[6],char_const(&)[5],int&,char_const(&)[6],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/lowdiscrepancy.h"
             ,0x1e,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [5])"base",
             (char (*) [6])"65536",(char (*) [5])"base",&va,(char (*) [6])"65536",&vb);
}

Assistant:

DigitPermutation(int base, uint32_t seed, Allocator alloc) : base(base) {
        CHECK_LT(base, 65536);  // uint16_t
        // Compute number of digits needed for _base_
        nDigits = 0;
        Float invBase = (Float)1 / (Float)base;
        Float invBaseN = 1;
        while (1 - invBaseN < 1) {
            ++nDigits;
            invBaseN *= invBase;
        }

        permutations = alloc.allocate_object<uint16_t>(nDigits * base);
        for (int digitIndex = 0; digitIndex < nDigits; ++digitIndex) {
            // Compute random permutation for _digitIndex_
            uint32_t digitSeed = (base * 32 + digitIndex) ^ seed;
            for (int digitValue = 0; digitValue < base; ++digitValue)
                Perm(digitIndex, digitValue) =
                    PermutationElement(digitValue, base, digitSeed);
        }
    }